

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O3

pair<bool,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
* __thiscall
jessilib::mbstring_to_ustring<char8_t>
          (pair<bool,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
           *__return_storage_ptr__,jessilib *this,string_view in_mbstring)

{
  jessilib *pjVar1;
  jessilib *pjVar2;
  char32_t codepoint;
  mbstate_t mbstate;
  char32_t local_44;
  anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
  *local_40;
  undefined8 local_38;
  
  pjVar2 = (jessilib *)in_mbstring._M_len;
  __return_storage_ptr__->first = false;
  local_40 = &(__return_storage_ptr__->second).field_2;
  (__return_storage_ptr__->second)._M_dataplus._M_p = (pointer)local_40;
  (__return_storage_ptr__->second)._M_string_length = 0;
  (__return_storage_ptr__->second).field_2._M_local_buf[0] = '\0';
  local_38 = 0;
  if (this != (jessilib *)0x0) {
    do {
      local_44 = L'\0';
      pjVar1 = (jessilib *)mbrtoc32(&local_44,pjVar2,this,&local_38);
      if (this < pjVar1) {
        __return_storage_ptr__->first = false;
        return __return_storage_ptr__;
      }
      encode_codepoint_utf8<char8_t,std::__cxx11::u8string>
                (&__return_storage_ptr__->second,local_44);
      pjVar2 = pjVar2 + (long)(pjVar1 + (pjVar1 == (jessilib *)0x0));
      this = this + -(long)(pjVar1 + (pjVar1 == (jessilib *)0x0));
    } while (this != (jessilib *)0x0);
  }
  __return_storage_ptr__->first = true;
  return __return_storage_ptr__;
}

Assistant:

std::pair<bool, std::basic_string<CharT>> mbstring_to_ustring(std::string_view in_mbstring) {
	std::pair<bool, std::basic_string<CharT>> result;

	std::mbstate_t mbstate{};
	while (!in_mbstring.empty()) {
		char32_t codepoint{};
		size_t bytes_read = std::mbrtoc32(&codepoint, in_mbstring.data(), in_mbstring.size(), &mbstate);
		if (bytes_read > in_mbstring.size()) {
			// Some sort of error; return
			result.first = false;
			return result;
		}

		// bytes_read is 0 for null characters; ensure null characters are also removed from the view
		bytes_read = std::max(size_t{1}, bytes_read);
		in_mbstring.remove_prefix(bytes_read);
		encode_codepoint(result.second, codepoint);
	}

	result.first = true;
	return result;
}